

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O0

void re2::AppendCCChar(string *t,Rune r)

{
  char *pcVar1;
  uint in_ESI;
  string *in_RDI;
  string local_60 [48];
  string local_30 [40];
  string *local_8;
  
  local_8 = in_RDI;
  if (((int)in_ESI < 0x20) || (0x7e < (int)in_ESI)) {
    switch(in_ESI) {
    case 9:
      std::__cxx11::string::append((char *)in_RDI);
      break;
    case 10:
      std::__cxx11::string::append((char *)in_RDI);
      break;
    default:
      if ((int)in_ESI < 0x100) {
        StringPrintf_abi_cxx11_((char *)local_30,"\\x%02x",(ulong)in_ESI);
        std::__cxx11::string::operator+=(local_8,local_30);
        std::__cxx11::string::~string(local_30);
      }
      else {
        StringPrintf_abi_cxx11_((char *)local_60,"\\x{%x}",(ulong)in_ESI);
        std::__cxx11::string::operator+=(local_8,local_60);
        std::__cxx11::string::~string(local_60);
      }
      break;
    case 0xc:
      std::__cxx11::string::append((char *)in_RDI);
      break;
    case 0xd:
      std::__cxx11::string::append((char *)in_RDI);
    }
  }
  else {
    pcVar1 = strchr("[]^-\\",in_ESI);
    if (pcVar1 != (char *)0x0) {
      std::__cxx11::string::append((char *)local_8);
    }
    std::__cxx11::string::append((ulong)local_8,'\x01');
  }
  return;
}

Assistant:

static void AppendCCChar(std::string* t, Rune r) {
  if (0x20 <= r && r <= 0x7E) {
    if (strchr("[]^-\\", r))
      t->append("\\");
    t->append(1, static_cast<char>(r));
    return;
  }
  switch (r) {
    default:
      break;

    case '\r':
      t->append("\\r");
      return;

    case '\t':
      t->append("\\t");
      return;

    case '\n':
      t->append("\\n");
      return;

    case '\f':
      t->append("\\f");
      return;
  }

  if (r < 0x100) {
    *t += StringPrintf("\\x%02x", static_cast<int>(r));
    return;
  }
  *t += StringPrintf("\\x{%x}", static_cast<int>(r));
}